

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.hpp
# Opt level: O0

deUint32 __thiscall
sglr::rc::ObjectManager<sglr::rc::ShaderProgramObjectContainer>::allocateName
          (ObjectManager<sglr::rc::ShaderProgramObjectContainer> *this)

{
  deBool dVar1;
  deUint32 dVar2;
  TestError *this_00;
  ObjectManager<sglr::rc::ShaderProgramObjectContainer> *this_local;
  
  while( true ) {
    dVar1 = ::deGetFalse();
    if ((dVar1 != 0) || (this->m_lastName == 0xffffffff)) break;
    dVar1 = ::deGetFalse();
    if (dVar1 == 0) {
      dVar2 = this->m_lastName + 1;
      this->m_lastName = dVar2;
      return dVar2;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"m_lastName != 0xffffffff",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.hpp"
             ,0x1ee);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

deUint32 ObjectManager<T>::allocateName (void)
{
	TCU_CHECK(m_lastName != 0xffffffff);
	return ++m_lastName;
}